

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::ConstructMessageRecursive<int,_unsigned_int,_unsigned_int>
                   (string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,int param,uint params,uint params_1)

{
  string *in_RDI;
  undefined4 in_R9D;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  string *this;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  
  this = in_RDI;
  ExceptionFormatValue::CreateFormatValue<int>(in_stack_ffffffffffffff6c);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
            this,(value_type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0x2b210a5);
  ConstructMessageRecursive<unsigned_int,_unsigned_int>
            ((string *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}